

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O2

bool __thiscall wasm::ABI::wasm2js::isHelper(wasm2js *this,IString name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar7 = (int)name.str._M_len;
  iVar8 = name.str._M_len._4_4_;
  auVar13._0_4_ = -(uint)((int)DAT_01174f98 == iVar7);
  auVar13._4_4_ = -(uint)((int)((ulong)DAT_01174f98 >> 0x20) == iVar8);
  auVar13._8_4_ = -(uint)((int)DAT_01174fa8 == iVar7);
  auVar13._12_4_ = -(uint)((int)((ulong)DAT_01174fa8 >> 0x20) == iVar8);
  auVar18._4_4_ = auVar13._0_4_;
  auVar18._0_4_ = auVar13._4_4_;
  auVar18._8_4_ = auVar13._12_4_;
  auVar18._12_4_ = auVar13._8_4_;
  auVar16._0_4_ = -(uint)((int)DAT_01174f68 == iVar7);
  auVar16._4_4_ = -(uint)((int)((ulong)DAT_01174f68 >> 0x20) == iVar8);
  auVar16._8_4_ = -(uint)((int)DAT_01174f78 == iVar7);
  auVar16._12_4_ = -(uint)((int)((ulong)DAT_01174f78 >> 0x20) == iVar8);
  auVar14._4_4_ = auVar16._0_4_;
  auVar14._0_4_ = auVar16._4_4_;
  auVar14._8_4_ = auVar16._12_4_;
  auVar14._12_4_ = auVar16._8_4_;
  auVar15 = packssdw(auVar14 & auVar16,auVar18 & auVar13);
  auVar9._0_4_ = -(uint)((int)DAT_01174f48 == iVar7);
  auVar9._4_4_ = -(uint)((int)((ulong)DAT_01174f48 >> 0x20) == iVar8);
  auVar9._8_4_ = -(uint)((int)DAT_01174f58 == iVar7);
  auVar9._12_4_ = -(uint)((int)((ulong)DAT_01174f58 >> 0x20) == iVar8);
  auVar17._4_4_ = auVar9._0_4_;
  auVar17._0_4_ = auVar9._4_4_;
  auVar17._8_4_ = auVar9._12_4_;
  auVar17._12_4_ = auVar9._8_4_;
  auVar12._0_4_ = -(uint)((int)DAT_01174f28 == iVar7);
  auVar12._4_4_ = -(uint)((int)((ulong)DAT_01174f28 >> 0x20) == iVar8);
  auVar12._8_4_ = -(uint)((int)DAT_01174f38 == iVar7);
  auVar12._12_4_ = -(uint)((int)((ulong)DAT_01174f38 >> 0x20) == iVar8);
  auVar10._4_4_ = auVar12._0_4_;
  auVar10._0_4_ = auVar12._4_4_;
  auVar10._8_4_ = auVar12._12_4_;
  auVar10._12_4_ = auVar12._8_4_;
  auVar11 = packssdw(auVar10 & auVar12,auVar17 & auVar9);
  auVar12 = packssdw(auVar11,auVar15);
  auVar3._0_4_ = -(uint)((int)DAT_01174f88 == iVar7);
  auVar3._4_4_ = -(uint)((int)((ulong)DAT_01174f88 >> 0x20) == iVar8);
  auVar3._8_4_ = -(uint)((int)DAT_01174f18 == iVar7);
  auVar3._12_4_ = -(uint)((int)((ulong)DAT_01174f18 >> 0x20) == iVar8);
  auVar6._4_4_ = auVar3._0_4_;
  auVar6._0_4_ = auVar3._4_4_;
  auVar6._8_4_ = auVar3._12_4_;
  auVar6._12_4_ = auVar3._8_4_;
  auVar5._0_4_ = -(uint)((int)DAT_01174ef8 == iVar7);
  auVar5._4_4_ = -(uint)((int)((ulong)DAT_01174ef8 >> 0x20) == iVar8);
  auVar5._8_4_ = -(uint)((int)DAT_01174f08 == iVar7);
  auVar5._12_4_ = -(uint)((int)((ulong)DAT_01174f08 >> 0x20) == iVar8);
  auVar4._4_4_ = auVar5._0_4_;
  auVar4._0_4_ = auVar5._4_4_;
  auVar4._8_4_ = auVar5._12_4_;
  auVar4._12_4_ = auVar5._8_4_;
  auVar5 = packssdw(auVar4 & auVar5,auVar6 & auVar3);
  auVar15._0_4_ = -(uint)((int)DAT_01174ed8 == iVar7);
  auVar15._4_4_ = -(uint)((int)((ulong)DAT_01174ed8 >> 0x20) == iVar8);
  auVar15._8_4_ = -(uint)((int)DAT_01174ee8 == iVar7);
  auVar15._12_4_ = -(uint)((int)((ulong)DAT_01174ee8 >> 0x20) == iVar8);
  auVar2._4_4_ = auVar15._0_4_;
  auVar2._0_4_ = auVar15._4_4_;
  auVar2._8_4_ = auVar15._12_4_;
  auVar2._12_4_ = auVar15._8_4_;
  auVar11._0_4_ = -(uint)((int)DAT_01174eb8 == iVar7);
  auVar11._4_4_ = -(uint)((int)((ulong)DAT_01174eb8 >> 0x20) == iVar8);
  auVar11._8_4_ = -(uint)((int)DAT_01174ec8 == iVar7);
  auVar11._12_4_ = -(uint)((int)((ulong)DAT_01174ec8 >> 0x20) == iVar8);
  auVar1._4_4_ = auVar11._0_4_;
  auVar1._0_4_ = auVar11._4_4_;
  auVar1._8_4_ = auVar11._12_4_;
  auVar1._12_4_ = auVar11._8_4_;
  auVar11 = packssdw(auVar1 & auVar11,auVar2 & auVar15);
  auVar11 = packssdw(auVar11,auVar5);
  auVar11 = packsswb(auVar11,auVar12);
  return DAT_01174fb8 == name.str._M_len ||
         ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar11 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar11 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar11 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar11 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar11 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar11 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar11 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar11 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar11 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar11 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar11 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar11 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar11[0xf] < '\0'
         );
}

Assistant:

inline bool isHelper(IString name) {
  return name == SCRATCH_LOAD_I32 || name == SCRATCH_STORE_I32 ||
         name == SCRATCH_LOAD_F32 || name == SCRATCH_STORE_F32 ||
         name == SCRATCH_LOAD_F64 || name == SCRATCH_STORE_F64 ||
         name == ATOMIC_WAIT_I32 || name == MEMORY_INIT ||
         name == MEMORY_FILL || name == MEMORY_COPY || name == TABLE_GROW ||
         name == TABLE_FILL || name == TABLE_COPY || name == DATA_DROP ||
         name == ATOMIC_RMW_I64 || name == GET_STASHED_BITS || name == TRAP;
}